

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O0

FUNCTIONALITY_SUPPORT gl4cts::BufferStorage::getDirectStateAccessSupport(Context *context)

{
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  ContextInfo *this;
  bool is_supported;
  Functions *gl;
  Context *context_local;
  
  if (m_direct_state_access_support == FUNCTIONALITY_SUPPORT_NOT_DETERMINED) {
    pRVar3 = deqp::Context::getRenderContext(context);
    iVar2 = (*pRVar3->_vptr_RenderContext[3])();
    bVar1 = isGLVersionAtLeast((Functions *)CONCAT44(extraout_var,iVar2),4,5);
    if (bVar1) {
      m_direct_state_access_support = FUNCTIONALITY_SUPPORT_CORE;
    }
    else {
      this = deqp::Context::getContextInfo(context);
      bVar1 = glu::ContextInfo::isExtensionSupported(this,"GL_ARB_direct_state_access");
      m_direct_state_access_support = (FUNCTIONALITY_SUPPORT)bVar1;
    }
  }
  return m_direct_state_access_support;
}

Assistant:

FUNCTIONALITY_SUPPORT getDirectStateAccessSupport(deqp::Context& context)
{
	if (FUNCTIONALITY_SUPPORT_NOT_DETERMINED == m_direct_state_access_support)
	{
		const Functions& gl = context.getRenderContext().getFunctions();

		if (true == isGLVersionAtLeast(gl, 4, 5))
		{
			m_direct_state_access_support = FUNCTIONALITY_SUPPORT_CORE;
		}
		else
		{
			bool is_supported = context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

			if (true == is_supported)
			{
				m_direct_state_access_support = FUNCTIONALITY_SUPPORT_EXTENSION;
			}
			else
			{
				m_direct_state_access_support = FUNCTIONALITY_SUPPORT_NONE;
			}
		}
	}

	return m_direct_state_access_support;
}